

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datastructure.h
# Opt level: O1

void __thiscall
CardStyle::CardStyle
          (CardStyle *this,Type t,int d,multiset<char,_std::less<char>,_std::allocator<char>_> *p,
          int l,int c)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->pattern)._M_t._M_impl.super__Rb_tree_header;
  (this->pattern)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pattern)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pattern)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pattern)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pattern)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->type = t;
  this->id = d;
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::operator=
            (&(this->pattern)._M_t,&p->_M_t);
  this->len = l;
  this->carry = c;
  return;
}

Assistant:

CardStyle(Type t = PASS, int d = 0, std::multiset<byte> p=std::multiset<byte>(), int l = 1, int c = 0) {
        type = t;
        id = d;
        pattern = p;
        len = l;
        carry = c;
    }